

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

void __thiscall Rml::DataViewText::DataViewText(DataViewText *this,Element *element)

{
  Element *element_local;
  DataViewText *this_local;
  
  DataView::DataView(&this->super_DataView,element,0);
  (this->super_DataView).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewText_00815648;
  ::std::__cxx11::string::string((string *)&this->text);
  ::std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>::vector
            (&this->data_entries);
  return;
}

Assistant:

DataViewText::DataViewText(Element* element) : DataView(element, 0) {}